

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_track.h
# Opt level: O0

uint32_t __thiscall
event_track::EventMessageInstanceBox::parse
          (EventMessageInstanceBox *this,char *ptr,uint data_size,uint64_t pres_time)

{
  uint32_t uVar1;
  uint64_t uVar2;
  char *pcVar3;
  long lVar4;
  value_type local_99;
  uint local_98;
  allocator local_91;
  uint i;
  allocator local_59;
  string local_58 [32];
  uint64_t local_38;
  uint64_t offset;
  uint64_t pres_time_local;
  char *pcStack_20;
  uint data_size_local;
  char *ptr_local;
  EventMessageInstanceBox *this_local;
  
  if (data_size < 9) {
    this_local._4_4_ = 0;
  }
  else {
    offset = pres_time;
    pres_time_local._4_4_ = data_size;
    pcStack_20 = ptr;
    ptr_local = (char *)this;
    fmp4_stream::full_box::parse(&this->super_full_box,ptr);
    local_38 = fmp4_stream::full_box::size(&this->super_full_box);
    uVar1 = anon_unknown.dwarf_13fa5::fmp4_read_uint32(pcStack_20 + local_38);
    *(uint32_t *)&(this->super_full_box).field_0x6c = uVar1;
    local_38 = local_38 + 4;
    uVar2 = anon_unknown.dwarf_13fa5::fmp4_read_uint64(pcStack_20 + local_38);
    this->presentation_time_delta_ = uVar2;
    local_38 = local_38 + 8;
    uVar1 = anon_unknown.dwarf_13fa5::fmp4_read_uint32(pcStack_20 + local_38);
    this->event_duration_ = uVar1;
    local_38 = local_38 + 4;
    uVar1 = anon_unknown.dwarf_13fa5::fmp4_read_uint32(pcStack_20 + local_38);
    this->id_ = uVar1;
    local_38 = local_38 + 4;
    pcVar3 = pcStack_20 + local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_58,pcVar3,&local_59);
    std::__cxx11::string::operator=((string *)&this->scheme_id_uri_,local_58);
    std::__cxx11::string::~string(local_58);
    std::allocator<char>::~allocator((allocator<char> *)&local_59);
    uVar2 = local_38;
    lVar4 = std::__cxx11::string::size();
    local_38 = uVar2 + 1 + lVar4;
    pcVar3 = pcStack_20 + local_38;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&i,pcVar3,&local_91);
    std::__cxx11::string::operator=((string *)&this->value_,(string *)&i);
    std::__cxx11::string::~string((string *)&i);
    std::allocator<char>::~allocator((allocator<char> *)&local_91);
    uVar2 = local_38;
    lVar4 = std::__cxx11::string::size();
    local_38 = uVar2 + lVar4 + 1;
    for (local_98 = (uint)local_38; local_98 < (this->super_full_box).super_box.size_;
        local_98 = local_98 + 1) {
      local_99 = pcStack_20[local_98];
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                (&this->message_data_,&local_99);
    }
    this_local._4_4_ = (this->super_full_box).super_box.size_;
  }
  return this_local._4_4_;
}

Assistant:

uint32_t parse(const char *ptr, unsigned int data_size, uint64_t pres_time=0)
		{
			if (data_size > 8) 
			{
				fmp4_stream::full_box::parse(ptr);
				uint64_t offset = full_box::size();

				reserved_ = fmp4_read_uint32(ptr + offset);
				//cout << "timescale: " << timescale << endl;
				offset += 4;
				presentation_time_delta_ = fmp4_read_uint64(ptr + offset);
				//cout << "presentation time: " << presentation_time << endl;
				offset += 8;
				event_duration_ = fmp4_read_uint32(ptr + offset);
				//cout << "event duration: " << event_duration << endl;
				offset += 4;
				id_ = fmp4_read_uint32(ptr + offset);
				offset += 4;
				//cout << "id: " << id << endl;
				scheme_id_uri_ = std::string(ptr + offset);
				offset = offset + scheme_id_uri_.size() + 1;
				//cout << "scheme_id_uri: " << scheme_id_uri << endl;
				value_ = std::string(ptr + offset);
				//cout << "value: " << value << endl;
				offset = offset + value_.size() + 1;

				for (unsigned int i = (unsigned int)offset; i < size_; i++)
					message_data_.push_back(*(ptr + (size_t)i));

				return size_;
			}
			return 0;
		}